

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

GLint __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::getMaximumImageUniformsForStage
          (ImageLoadStoreMultipleUniformsTest *this,shaderStage stage)

{
  GLenum err;
  TestError *this_00;
  GLenum local_1c;
  GLint local_18;
  GLenum pname;
  GLint max_image_uniforms;
  shaderStage stage_local;
  ImageLoadStoreMultipleUniformsTest *this_local;
  
  local_18 = 0;
  pname = stage;
  _max_image_uniforms = this;
  switch(stage) {
  case fragmentShaderStage:
    local_1c = 0x90ce;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid shader stage",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
               ,0x2412);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  case geometryShaderStage:
    local_1c = 0x90cd;
    break;
  case tesselationControlShaderStage:
    local_1c = 0x90cb;
    break;
  case tesselationEvalutaionShaderStage:
    local_1c = 0x90cc;
    break;
  case vertexShaderStage:
    local_1c = 0x90ca;
  }
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_1c,&local_18);
  err = glu::CallLogWrapper::glGetError
                  (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper);
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                  ,0x2416);
  return local_18;
}

Assistant:

GLint getMaximumImageUniformsForStage(shaderStage stage)
	{
		GLint  max_image_uniforms = 0;
		GLenum pname			  = 0;

		switch (stage)
		{
		case fragmentShaderStage:
			pname = GL_MAX_FRAGMENT_IMAGE_UNIFORMS;
			break;

		case geometryShaderStage:
			pname = GL_MAX_GEOMETRY_IMAGE_UNIFORMS;
			break;

		case tesselationControlShaderStage:
			pname = GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS;
			break;

		case tesselationEvalutaionShaderStage:
			pname = GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS;
			break;

		case vertexShaderStage:
			pname = GL_MAX_VERTEX_IMAGE_UNIFORMS;
			break;

		default:
			TCU_FAIL("Invalid shader stage");
		}

		glGetIntegerv(pname, &max_image_uniforms);
		GLU_EXPECT_NO_ERROR(glGetError(), "GetIntegerv");

		return max_image_uniforms;
	}